

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O0

amqp_pool_t * amqp_get_or_create_channel_pool(amqp_connection_state_t state,amqp_channel_t channel)

{
  long lVar1;
  undefined8 *puVar2;
  ushort in_SI;
  long in_RDI;
  size_t index;
  amqp_pool_table_entry_t *entry;
  undefined8 *local_20;
  amqp_pool_t *local_8;
  
  lVar1 = (long)(int)((uint)in_SI % 0x10);
  local_20 = *(undefined8 **)(in_RDI + lVar1 * 8);
  while( true ) {
    if (local_20 == (undefined8 *)0x0) {
      puVar2 = (undefined8 *)malloc(0x50);
      if (puVar2 == (undefined8 *)0x0) {
        local_8 = (amqp_pool_t *)0x0;
      }
      else {
        *(ushort *)(puVar2 + 9) = in_SI;
        *puVar2 = *(undefined8 *)(in_RDI + lVar1 * 8);
        *(undefined8 **)(in_RDI + lVar1 * 8) = puVar2;
        init_amqp_pool((amqp_pool_t *)(puVar2 + 1),(long)*(int *)(in_RDI + 0x88));
        local_8 = (amqp_pool_t *)(puVar2 + 1);
      }
      return local_8;
    }
    if (in_SI == *(ushort *)(local_20 + 9)) break;
    local_20 = (undefined8 *)*local_20;
  }
  return (amqp_pool_t *)(local_20 + 1);
}

Assistant:

amqp_pool_t *amqp_get_or_create_channel_pool(amqp_connection_state_t state, amqp_channel_t channel)
{
  amqp_pool_table_entry_t *entry;
  size_t index = channel % POOL_TABLE_SIZE;

  entry = state->pool_table[index];

  for ( ; NULL != entry; entry = entry->next) {
    if (channel == entry->channel) {
      return &entry->pool;
    }
  }

  entry = malloc(sizeof(amqp_pool_table_entry_t));
  if (NULL == entry) {
    return NULL;
  }

  entry->channel = channel;
  entry->next = state->pool_table[index];
  state->pool_table[index] = entry;

  init_amqp_pool(&entry->pool, state->frame_max);

  return &entry->pool;
}